

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

void Lms_GiaNormalize(Lms_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  ulong uVar12;
  
  pVVar4 = Lms_GiaFindNonRedundantCos(p);
  uVar2 = pVVar4->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar8 = uVar2;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar8;
  if (uVar8 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar8 << 2);
  }
  p_00->pArray = piVar5;
  if (0 < (int)uVar2) {
    piVar5 = pVVar4->pArray;
    uVar12 = 0;
    iVar3 = -1;
    do {
      iVar7 = piVar5[uVar12];
      if ((long)iVar7 < 0) {
LAB_002fc88b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pGVar6 = p->pGia;
      if (pGVar6->vCos->nSize <= iVar7) goto LAB_002fc88b;
      iVar7 = pGVar6->vCos->pArray[iVar7];
      if (((long)iVar7 < 0) || (pGVar6->nObjs <= iVar7)) goto LAB_002fc86c;
      pGVar1 = pGVar6->pObjs + iVar7;
      if (((int)(uint)*(undefined8 *)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff)) < 0) ||
         (((uint)*(undefined8 *)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff)) & 0x1fffffff) ==
          0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(Gia_ObjFanin0(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x50b,"void Lms_GiaNormalize(Lms_Man_t *)");
      }
      uVar8 = (uint)*(ulong *)pGVar1;
      iVar7 = iVar7 - (uVar8 & 0x1fffffff);
      if (iVar7 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      piVar5[uVar12] = (uVar8 >> 0x1d & 1) + iVar7 * 2;
      if (-1 < (int)*(ulong *)pGVar1) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      uVar8 = (uint)(*(ulong *)pGVar1 >> 0x20);
      if (p->vTruthIds->nSize <= (int)(uVar8 & 0x1fffffff)) goto LAB_002fc88b;
      iVar7 = p->vTruthIds->pArray[uVar8 & 0x1fffffff];
      if (iVar7 < iVar3) {
        __assert_fail("Prev <= Next",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x50f,"void Lms_GiaNormalize(Lms_Man_t *)");
      }
      Vec_IntPush(p_00,iVar7);
      uVar12 = uVar12 + 1;
      iVar3 = iVar7;
    } while (uVar2 != uVar12);
  }
  pGVar6 = p->pGia;
  if ((0 < pGVar6->nObjs) && (pGVar6->pObjs != (Gia_Obj_t *)0x0)) {
    lVar9 = 0;
    do {
      if (((&pGVar6->pObjs->field_0x3)[lVar9] & 0x40) != 0) {
        __assert_fail("pObj->fMark0 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x515,"void Lms_GiaNormalize(Lms_Man_t *)");
      }
      lVar9 = lVar9 + 0xc;
    } while ((ulong)(uint)pGVar6->nObjs * 0xc != lVar9);
  }
  pVVar10 = pGVar6->vCos;
  if (0 < pVVar10->nSize) {
    lVar9 = 0;
    do {
      uVar8 = pVVar10->pArray[lVar9];
      lVar11 = (long)(int)uVar8;
      if ((lVar11 < 0) || (pGVar6->nObjs <= (int)uVar8)) {
LAB_002fc86c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar8 == 0) {
        __assert_fail("Gia_ObjId(p, pObjCo) > Abc_Lit2Var(iLit0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x36e,"void Gia_ManPatchCoDriver(Gia_Man_t *, int, int)");
      }
      *(ulong *)(pGVar6->pObjs + lVar11) =
           *(ulong *)(pGVar6->pObjs + lVar11) & 0xffffffffc0000000 | (ulong)(uVar8 & 0x1fffffff);
      lVar9 = lVar9 + 1;
      pGVar6 = p->pGia;
      pVVar10 = pGVar6->vCos;
    } while (lVar9 < pVVar10->nSize);
  }
  if (0 < (int)uVar2) {
    piVar5 = pVVar4->pArray;
    uVar12 = 0;
    do {
      Gia_ManAppendCo(p->pGia,piVar5[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar2 != uVar12);
    pGVar6 = p->pGia;
  }
  pGVar6 = Gia_ManCleanupOutputs(pGVar6,pGVar6->vCos->nSize - uVar2);
  Gia_ManStop(p->pGia);
  p->pGia = pGVar6;
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  pVVar4 = p->vTruthIds;
  piVar5 = pVVar4->pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar4);
  p->vTruthIds = p_00;
  return;
}

Assistant:

void Lms_GiaNormalize( Lms_Man_t * p )
{
    Gia_Man_t * pGiaNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vRemain;
    Vec_Int_t * vTruthIdsNew;
    int i, Entry, Prev = -1, Next;
    // collect non-redundant COs
    vRemain = Lms_GiaFindNonRedundantCos( p );
    // change these to be useful literals
    vTruthIdsNew = Vec_IntAlloc( Vec_IntSize(vRemain) );
    Vec_IntForEachEntry( vRemain, Entry, i )
    {
        pObj = Gia_ManCo(p->pGia, Entry);
        assert( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) );
        Vec_IntWriteEntry( vRemain, i, Gia_ObjFaninLit0p(p->pGia, pObj) );
        // create new truth IDs
        Next = Vec_IntEntry(p->vTruthIds, Gia_ObjCioId(pObj));
        assert( Prev <= Next );
        Vec_IntPush( vTruthIdsNew, Next );
        Prev = Next;
    }
    // create a new GIA
    Gia_ManForEachObj( p->pGia, pObj, i )
        assert( pObj->fMark0 == 0 );
    for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
        Gia_ManPatchCoDriver( p->pGia, i, 0 );
    Vec_IntForEachEntry( vRemain, Entry, i )
        Gia_ManAppendCo( p->pGia, Entry );
//    pGiaNew = Gia_ManCleanup( p->pGia );
    pGiaNew = Gia_ManCleanupOutputs( p->pGia, Gia_ManCoNum(p->pGia) - Vec_IntSize(vRemain) );
    Gia_ManStop( p->pGia );
    p->pGia = pGiaNew;
    Vec_IntFree( vRemain );
    // update truth IDs
    Vec_IntFree( p->vTruthIds );
    p->vTruthIds = vTruthIdsNew;
//    Vec_IntPrint( vTruthIdsNew );
}